

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O0

void __thiscall llvm::DelimitedScope<'[',_']'>::~DelimitedScope(DelimitedScope<_[_,__]_> *this)

{
  raw_ostream *prVar1;
  DelimitedScope<_[_,__]_> *this_local;
  
  ScopedPrinter::unindent(this->W,1);
  prVar1 = ScopedPrinter::startLine(this->W);
  prVar1 = raw_ostream::operator<<(prVar1,']');
  raw_ostream::operator<<(prVar1,'\n');
  return;
}

Assistant:

~DelimitedScope() {
    W.unindent();
    W.startLine() << Close << '\n';
  }